

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  long lVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  wchar_t *pwVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar29 [16];
  
  uVar9 = this->num_digits_;
  uVar11 = (ulong)uVar9;
  uVar6 = this->exp_;
  uVar13 = (ulong)uVar6;
  uVar8 = uVar6 + uVar9;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar12 = this->digits_;
    *it = (int)*pcVar12;
    uVar6 = (this->specs_).precision - uVar9;
    if ((int)uVar9 < 2) {
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        pwVar7 = it + 1;
      }
      else {
        it[1] = this->decimal_point_;
        pwVar7 = it + 2;
      }
    }
    else {
      it[1] = this->decimal_point_;
      pwVar7 = it + 2;
      do {
        pcVar12 = pcVar12 + 1;
        uVar11 = uVar11 - 1;
        *pwVar7 = (int)*pcVar12;
        pwVar7 = pwVar7 + 1;
      } while (1 < uVar11);
    }
    auVar5 = _DAT_0018c350;
    auVar4 = _DAT_00186920;
    auVar3 = _DAT_00186410;
    uVar9 = *(uint *)&(this->specs_).field_0x4;
    if ((uVar9 >> 0x15 & 1) != 0 && 0 < (int)uVar6) {
      uVar11 = (ulong)uVar6 + 0x3fffffffffffffff;
      uVar13 = uVar11 & 0x3fffffffffffffff;
      auVar21._8_4_ = (int)uVar13;
      auVar21._0_8_ = uVar13;
      auVar21._12_4_ = (int)(uVar13 >> 0x20);
      lVar14 = 0;
      auVar21 = auVar21 ^ _DAT_00186410;
      do {
        auVar26._8_4_ = (int)lVar14;
        auVar26._0_8_ = lVar14;
        auVar26._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar29 = (auVar26 | auVar4) ^ auVar3;
        iVar10 = auVar21._4_4_;
        if ((bool)(~(auVar29._4_4_ == iVar10 && auVar21._0_4_ < auVar29._0_4_ ||
                    iVar10 < auVar29._4_4_) & 1)) {
          pwVar7[lVar14] = L'0';
        }
        if ((auVar29._12_4_ != auVar21._12_4_ || auVar29._8_4_ <= auVar21._8_4_) &&
            auVar29._12_4_ <= auVar21._12_4_) {
          pwVar7[lVar14 + 1] = L'0';
        }
        auVar26 = (auVar26 | auVar5) ^ auVar3;
        iVar30 = auVar26._4_4_;
        if (iVar30 <= iVar10 && (iVar30 != iVar10 || auVar26._0_4_ <= auVar21._0_4_)) {
          pwVar7[lVar14 + 2] = L'0';
          pwVar7[lVar14 + 3] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
      uVar9 = *(uint *)&(this->specs_).field_0x4;
      pwVar7 = pwVar7 + uVar6;
    }
    *pwVar7 = (uint)((uVar9 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar7 = write_exponent<wchar_t,wchar_t*>(uVar8 - 1,pwVar7 + 1);
    return pwVar7;
  }
  if (-1 < (int)uVar6) {
    if (0 < (int)uVar9) {
      pcVar12 = this->digits_;
      uVar11 = uVar11 + 1;
      do {
        *it = (int)*pcVar12;
        pcVar12 = pcVar12 + 1;
        it = it + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
    auVar5 = _DAT_0018c350;
    auVar4 = _DAT_00186920;
    auVar3 = _DAT_00186410;
    pwVar7 = it;
    if (uVar13 != 0) {
      pwVar7 = it + uVar13;
      uVar11 = uVar13 + 0x3fffffffffffffff & 0x3fffffffffffffff;
      auVar29._8_4_ = (int)uVar11;
      auVar29._0_8_ = uVar11;
      auVar29._12_4_ = (int)(uVar11 >> 0x20);
      lVar14 = 0;
      auVar29 = auVar29 ^ _DAT_00186410;
      do {
        auVar24._8_4_ = (int)lVar14;
        auVar24._0_8_ = lVar14;
        auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar21 = (auVar24 | auVar4) ^ auVar3;
        iVar10 = auVar29._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar10 && auVar29._0_4_ < auVar21._0_4_ ||
                    iVar10 < auVar21._4_4_) & 1)) {
          it[lVar14] = L'0';
        }
        if ((auVar21._12_4_ != auVar29._12_4_ || auVar21._8_4_ <= auVar29._8_4_) &&
            auVar21._12_4_ <= auVar29._12_4_) {
          it[lVar14 + 1] = L'0';
        }
        auVar21 = (auVar24 | auVar5) ^ auVar3;
        iVar30 = auVar21._4_4_;
        if (iVar30 <= iVar10 && (iVar30 != iVar10 || auVar21._0_4_ <= auVar29._0_4_)) {
          it[lVar14 + 2] = L'0';
          it[lVar14 + 3] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar11 - ((uint)(uVar13 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
    }
    iVar10 = (this->specs_).precision;
    if ((byte)(iVar10 < 0 | ((this->specs_).field_0x6 & 0x20) >> 5) != 1) {
      return pwVar7;
    }
    *pwVar7 = this->decimal_point_;
    auVar5 = _DAT_0018c350;
    auVar4 = _DAT_00186920;
    auVar3 = _DAT_00186410;
    uVar9 = iVar10 - uVar8;
    if (uVar9 != 0 && (int)uVar8 <= iVar10) {
      uVar11 = (ulong)uVar9 + 0x3fffffffffffffff;
      uVar13 = uVar11 & 0x3fffffffffffffff;
      auVar20._8_4_ = (int)uVar13;
      auVar20._0_8_ = uVar13;
      auVar20._12_4_ = (int)(uVar13 >> 0x20);
      lVar14 = 0;
      auVar20 = auVar20 ^ _DAT_00186410;
      do {
        auVar25._8_4_ = (int)lVar14;
        auVar25._0_8_ = lVar14;
        auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar21 = (auVar25 | auVar4) ^ auVar3;
        iVar10 = auVar20._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar10 && auVar20._0_4_ < auVar21._0_4_ ||
                    iVar10 < auVar21._4_4_) & 1)) {
          pwVar7[lVar14 + 1] = L'0';
        }
        if ((auVar21._12_4_ != auVar20._12_4_ || auVar21._8_4_ <= auVar20._8_4_) &&
            auVar21._12_4_ <= auVar20._12_4_) {
          pwVar7[lVar14 + 2] = L'0';
        }
        auVar21 = (auVar25 | auVar5) ^ auVar3;
        iVar30 = auVar21._4_4_;
        if (iVar30 <= iVar10 && (iVar30 != iVar10 || auVar21._0_4_ <= auVar20._0_4_)) {
          pwVar7[lVar14 + 3] = L'0';
          pwVar7[lVar14 + 4] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
      return pwVar7 + 1 + uVar9;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return pwVar7 + 1;
    }
    pwVar7[1] = L'0';
    return pwVar7 + 2;
  }
  if (0 < (int)uVar8) {
    lVar17 = (long)(int)uVar9;
    pcVar12 = this->digits_;
    uVar13 = (ulong)uVar8;
    uVar11 = uVar13 + 1;
    lVar18 = 0;
    lVar14 = 0;
    do {
      it[lVar18] = (int)pcVar12[lVar18];
      uVar11 = uVar11 - 1;
      lVar14 = lVar14 + -4;
      lVar18 = lVar18 + 1;
    } while (1 < uVar11);
    pcVar15 = pcVar12 + uVar13;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      pwVar7 = (wchar_t *)((long)it + (4 - lVar14));
      it[lVar18] = this->decimal_point_;
      if (lVar17 - uVar13 != 0 && (long)uVar13 <= lVar17) {
        uVar11 = (lVar17 - uVar13) + 1;
        do {
          *pwVar7 = (int)*pcVar15;
          pcVar15 = pcVar15 + 1;
          pwVar7 = pwVar7 + 1;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      auVar5 = _DAT_0018c350;
      auVar4 = _DAT_00186920;
      auVar3 = _DAT_00186410;
      iVar10 = (this->specs_).precision;
      uVar6 = iVar10 - uVar9;
      if (uVar6 == 0 || iVar10 < (int)uVar9) {
        return pwVar7;
      }
      if (uVar6 == 0 || iVar10 < (int)uVar9) {
        return pwVar7;
      }
      uVar11 = (ulong)uVar6 + 0x3fffffffffffffff;
      uVar13 = uVar11 & 0x3fffffffffffffff;
      auVar22._8_4_ = (int)uVar13;
      auVar22._0_8_ = uVar13;
      auVar22._12_4_ = (int)(uVar13 >> 0x20);
      lVar14 = 0;
      auVar22 = auVar22 ^ _DAT_00186410;
      do {
        auVar27._8_4_ = (int)lVar14;
        auVar27._0_8_ = lVar14;
        auVar27._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar21 = (auVar27 | auVar4) ^ auVar3;
        iVar10 = auVar22._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar10 && auVar22._0_4_ < auVar21._0_4_ ||
                    iVar10 < auVar21._4_4_) & 1)) {
          pwVar7[lVar14] = L'0';
        }
        if ((auVar21._12_4_ != auVar22._12_4_ || auVar21._8_4_ <= auVar22._8_4_) &&
            auVar21._12_4_ <= auVar22._12_4_) {
          pwVar7[lVar14 + 1] = L'0';
        }
        auVar21 = (auVar27 | auVar5) ^ auVar3;
        iVar30 = auVar21._4_4_;
        if (iVar30 <= iVar10 && (iVar30 != iVar10 || auVar21._0_4_ <= auVar22._0_4_)) {
          pwVar7[lVar14 + 2] = L'0';
          pwVar7[lVar14 + 3] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar13 - ((uint)uVar11 & 3)) + 4 != lVar14);
      return pwVar7 + uVar6;
    }
    lVar1 = -lVar14;
    uVar6 = uVar9 - 1;
    if ((int)uVar8 < (int)(uVar9 - 1)) {
      uVar6 = uVar8;
    }
    do {
      if (pcVar12[lVar17 + -1] != '0') {
        uVar6 = (uint)lVar17;
        break;
      }
      lVar17 = lVar17 + -1;
    } while ((long)uVar13 < lVar17);
    if (uVar6 != uVar8) {
      lVar1 = 4 - lVar14;
      it[lVar18] = this->decimal_point_;
    }
    pwVar7 = (wchar_t *)((long)it + lVar1);
    lVar14 = (long)(int)uVar6 - uVar13;
    if (lVar14 == 0 || (long)(int)uVar6 < (long)uVar13) {
      return pwVar7;
    }
    uVar11 = lVar14 + 1;
    do {
      *pwVar7 = (int)*pcVar15;
      pcVar15 = pcVar15 + 1;
      pwVar7 = pwVar7 + 1;
      uVar11 = uVar11 - 1;
    } while (1 < uVar11);
    return pwVar7;
  }
  *it = L'0';
  uVar6 = -uVar8;
  if (uVar9 == 0) {
    uVar9 = (this->specs_).precision;
    uVar2 = uVar6;
    if (SBORROW4(uVar9,uVar6) != (int)(uVar9 + uVar8) < 0) {
      uVar2 = uVar9;
    }
    if (-1 < (int)uVar9) {
      uVar6 = uVar2;
    }
    bVar19 = ((this->specs_).field_0x6 & 0x20) == 0;
  }
  else {
    uVar8 = *(uint *)&(this->specs_).field_0x4 & 0x200000;
    bVar19 = uVar8 == 0;
    if ((int)uVar9 < 1 || (char)(uVar8 >> 0x15) != '\0') goto LAB_00182971;
    bVar19 = true;
    do {
      iVar10 = (int)uVar11;
      if (this->digits_[uVar11 - 1] != '0') goto LAB_00182971;
      uVar11 = (ulong)(iVar10 - 1);
    } while (1 < iVar10);
  }
  uVar11 = 0;
LAB_00182971:
  if (((int)uVar11 == 0 && uVar6 == 0) && (bVar19)) {
    pwVar7 = it + 1;
  }
  else {
    pwVar7 = it + 2;
    it[1] = this->decimal_point_;
    auVar5 = _DAT_0018c350;
    auVar4 = _DAT_00186920;
    auVar3 = _DAT_00186410;
    if (0 < (int)uVar6) {
      pwVar7 = pwVar7 + uVar6;
      uVar13 = (ulong)uVar6 + 0x3fffffffffffffff;
      uVar16 = uVar13 & 0x3fffffffffffffff;
      auVar23._8_4_ = (int)uVar16;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      lVar14 = 0;
      auVar23 = auVar23 ^ _DAT_00186410;
      do {
        auVar28._8_4_ = (int)lVar14;
        auVar28._0_8_ = lVar14;
        auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
        auVar21 = (auVar28 | auVar4) ^ auVar3;
        iVar10 = auVar23._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar10 && auVar23._0_4_ < auVar21._0_4_ ||
                    iVar10 < auVar21._4_4_) & 1)) {
          it[lVar14 + 2] = L'0';
        }
        if ((auVar21._12_4_ != auVar23._12_4_ || auVar21._8_4_ <= auVar23._8_4_) &&
            auVar21._12_4_ <= auVar23._12_4_) {
          it[lVar14 + 3] = L'0';
        }
        auVar21 = (auVar28 | auVar5) ^ auVar3;
        iVar30 = auVar21._4_4_;
        if (iVar30 <= iVar10 && (iVar30 != iVar10 || auVar21._0_4_ <= auVar23._0_4_)) {
          it[lVar14 + 4] = L'0';
          it[lVar14 + 5] = L'0';
        }
        lVar14 = lVar14 + 4;
      } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar14);
    }
    if (0 < (int)uVar11) {
      pcVar12 = this->digits_;
      uVar11 = uVar11 + 1;
      do {
        *pwVar7 = (int)*pcVar12;
        pcVar12 = pcVar12 + 1;
        pwVar7 = pwVar7 + 1;
        uVar11 = uVar11 - 1;
      } while (1 < uVar11);
    }
  }
  return pwVar7;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }